

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha1.c
# Opt level: O0

void pp_crypto_hash_sha1_process(PHashSHA1 *ctx,puint32 *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  puint32 E;
  puint32 D;
  puint32 C;
  puint32 B;
  puint32 A;
  puint32 W [16];
  puint32 *data_local;
  PHashSHA1 *ctx_local;
  
  if (ctx != (PHashSHA1 *)0x0) {
    W._56_8_ = data;
    memcpy(&B,data,0x40);
    uVar4 = ctx->hash[0];
    uVar3 = ctx->hash[1];
    uVar5 = ctx->hash[2];
    uVar1 = (uVar4 << 5 | uVar4 >> 0x1b) + (uVar3 & uVar5 | (uVar3 ^ 0xffffffff) & ctx->hash[3]) +
            0x5a827999 + B + ctx->hash[4];
    uVar2 = uVar3 << 0x1e | uVar3 >> 2;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 & uVar2 | (uVar4 ^ 0xffffffff) & uVar5) +
            0x5a827999 + A + ctx->hash[3];
    uVar4 = uVar4 << 0x1e | uVar4 >> 2;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 & uVar4 | (uVar1 ^ 0xffffffff) & uVar2) +
            0x5a827999 + W[0] + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 & uVar1 | (uVar3 ^ 0xffffffff) & uVar4) +
            0x5a827999 + W[1] + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 & uVar3 | (uVar5 ^ 0xffffffff) & uVar1) +
            0x5a827999 + W[2] + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar3) +
            0x5a827999 + W[3] + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 & uVar2 | (uVar4 ^ 0xffffffff) & uVar5) +
            0x5a827999 + W[4] + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 & uVar4 | (uVar1 ^ 0xffffffff) & uVar2) +
            0x5a827999 + W[5] + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 & uVar1 | (uVar3 ^ 0xffffffff) & uVar4) +
            0x5a827999 + W[6] + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 & uVar3 | (uVar5 ^ 0xffffffff) & uVar1) +
            0x5a827999 + W[7] + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar3) +
            0x5a827999 + W[8] + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 & uVar2 | (uVar4 ^ 0xffffffff) & uVar5) +
            0x5a827999 + W[9] + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 & uVar4 | (uVar1 ^ 0xffffffff) & uVar2) +
            0x5a827999 + W[10] + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 & uVar1 | (uVar3 ^ 0xffffffff) & uVar4) +
            0x5a827999 + W[0xb] + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 & uVar3 | (uVar5 ^ 0xffffffff) & uVar1) +
            0x5a827999 + W[0xc] + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar3) +
            0x5a827999 + W[0xd] + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar6 = (W[0xb] ^ W[6] ^ W[0] ^ B) << 1 | (W[0xb] ^ W[6] ^ W[0] ^ B) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 & uVar2 | (uVar4 ^ 0xffffffff) & uVar5) +
            0x5a827999 + uVar6 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar7 = (W[0xc] ^ W[7] ^ W[1] ^ A) << 1 | (W[0xc] ^ W[7] ^ W[1] ^ A) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 & uVar4 | (uVar1 ^ 0xffffffff) & uVar2) +
            0x5a827999 + uVar7 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar8 = (W[0xd] ^ W[8] ^ W[2] ^ W[0]) << 1 | (W[0xd] ^ W[8] ^ W[2] ^ W[0]) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 & uVar1 | (uVar3 ^ 0xffffffff) & uVar4) +
            0x5a827999 + uVar8 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar9 = (uVar6 ^ W[9] ^ W[3] ^ W[1]) << 1 | (uVar6 ^ W[9] ^ W[3] ^ W[1]) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 & uVar3 | (uVar5 ^ 0xffffffff) & uVar1) +
            0x5a827999 + uVar9 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar10 = (uVar7 ^ W[10] ^ W[4] ^ W[2]) << 1 | (uVar7 ^ W[10] ^ W[4] ^ W[2]) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 ^ uVar5 ^ uVar3) + 0x6ed9eba1 + uVar10 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar11 = (uVar8 ^ W[0xb] ^ W[5] ^ W[3]) << 1 | (uVar8 ^ W[0xb] ^ W[5] ^ W[3]) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 ^ uVar2 ^ uVar5) + 0x6ed9eba1 + uVar11 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar12 = (uVar9 ^ W[0xc] ^ W[6] ^ W[4]) << 1 | (uVar9 ^ W[0xc] ^ W[6] ^ W[4]) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar4 ^ uVar2) + 0x6ed9eba1 + uVar12 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar13 = (uVar10 ^ W[0xd] ^ W[7] ^ W[5]) << 1 | (uVar10 ^ W[0xd] ^ W[7] ^ W[5]) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 ^ uVar1 ^ uVar4) + 0x6ed9eba1 + uVar13 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar14 = (uVar11 ^ uVar6 ^ W[8] ^ W[6]) << 1 | (uVar11 ^ uVar6 ^ W[8] ^ W[6]) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 ^ uVar3 ^ uVar1) + 0x6ed9eba1 + uVar14 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar15 = (uVar12 ^ uVar7 ^ W[9] ^ W[7]) << 1 | (uVar12 ^ uVar7 ^ W[9] ^ W[7]) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 ^ uVar5 ^ uVar3) + 0x6ed9eba1 + uVar15 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar16 = (uVar13 ^ uVar8 ^ W[10] ^ W[8]) << 1 | (uVar13 ^ uVar8 ^ W[10] ^ W[8]) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 ^ uVar2 ^ uVar5) + 0x6ed9eba1 + uVar16 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar17 = (uVar14 ^ uVar9 ^ W[0xb] ^ W[9]) << 1 | (uVar14 ^ uVar9 ^ W[0xb] ^ W[9]) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar4 ^ uVar2) + 0x6ed9eba1 + uVar17 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar18 = (uVar15 ^ uVar10 ^ W[0xc] ^ W[10]) << 1 | (uVar15 ^ uVar10 ^ W[0xc] ^ W[10]) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 ^ uVar1 ^ uVar4) + 0x6ed9eba1 + uVar18 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar19 = (uVar16 ^ uVar11 ^ W[0xd] ^ W[0xb]) << 1 | (uVar16 ^ uVar11 ^ W[0xd] ^ W[0xb]) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 ^ uVar3 ^ uVar1) + 0x6ed9eba1 + uVar19 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ W[0xc]) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ W[0xc]) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 ^ uVar5 ^ uVar3) + 0x6ed9eba1 + uVar20 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ W[0xd]) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ W[0xd]) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 ^ uVar2 ^ uVar5) + 0x6ed9eba1 + uVar21 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar4 ^ uVar2) + 0x6ed9eba1 + uVar6 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 ^ uVar1 ^ uVar4) + 0x6ed9eba1 + uVar7 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 ^ uVar3 ^ uVar1) + 0x6ed9eba1 + uVar8 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 ^ uVar5 ^ uVar3) + 0x6ed9eba1 + uVar9 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 ^ uVar2 ^ uVar5) + 0x6ed9eba1 + uVar10 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar4 ^ uVar2) + 0x6ed9eba1 + uVar11 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 ^ uVar1 ^ uVar4) + 0x6ed9eba1 + uVar12 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 ^ uVar3 ^ uVar1) + 0x6ed9eba1 + uVar13 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 & (uVar5 | uVar3) | uVar5 & uVar3) + -0x70e44324
            + uVar14 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 & (uVar2 | uVar5) | uVar2 & uVar5) + -0x70e44324
            + uVar15 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 & (uVar4 | uVar2) | uVar4 & uVar2) + -0x70e44324
            + uVar16 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 & (uVar1 | uVar4) | uVar1 & uVar4) + -0x70e44324
            + uVar17 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 & (uVar3 | uVar1) | uVar3 & uVar1) + -0x70e44324
            + uVar18 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 & (uVar5 | uVar3) | uVar5 & uVar3) + -0x70e44324
            + uVar19 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 & (uVar2 | uVar5) | uVar2 & uVar5) + -0x70e44324
            + uVar20 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 & (uVar4 | uVar2) | uVar4 & uVar2) + -0x70e44324
            + uVar21 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 & (uVar1 | uVar4) | uVar1 & uVar4) + -0x70e44324
            + uVar6 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 & (uVar3 | uVar1) | uVar3 & uVar1) + -0x70e44324
            + uVar7 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 & (uVar5 | uVar3) | uVar5 & uVar3) + -0x70e44324
            + uVar8 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 & (uVar2 | uVar5) | uVar2 & uVar5) + -0x70e44324
            + uVar9 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 & (uVar4 | uVar2) | uVar4 & uVar2) + -0x70e44324
            + uVar10 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 & (uVar1 | uVar4) | uVar1 & uVar4) + -0x70e44324
            + uVar11 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 & (uVar3 | uVar1) | uVar3 & uVar1) + -0x70e44324
            + uVar12 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 & (uVar5 | uVar3) | uVar5 & uVar3) + -0x70e44324
            + uVar13 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 & (uVar2 | uVar5) | uVar2 & uVar5) + -0x70e44324
            + uVar14 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 & (uVar4 | uVar2) | uVar4 & uVar2) + -0x70e44324
            + uVar15 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 & (uVar1 | uVar4) | uVar1 & uVar4) + -0x70e44324
            + uVar16 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 & (uVar3 | uVar1) | uVar3 & uVar1) + -0x70e44324
            + uVar17 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 ^ uVar5 ^ uVar3) + -0x359d3e2a + uVar18 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 ^ uVar2 ^ uVar5) + -0x359d3e2a + uVar19 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar4 ^ uVar2) + -0x359d3e2a + uVar20 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 ^ uVar1 ^ uVar4) + -0x359d3e2a + uVar21 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 ^ uVar3 ^ uVar1) + -0x359d3e2a + uVar6 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 ^ uVar5 ^ uVar3) + -0x359d3e2a + uVar7 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 ^ uVar2 ^ uVar5) + -0x359d3e2a + uVar8 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar4 ^ uVar2) + -0x359d3e2a + uVar9 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 ^ uVar1 ^ uVar4) + -0x359d3e2a + uVar10 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 ^ uVar3 ^ uVar1) + -0x359d3e2a + uVar11 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 ^ uVar5 ^ uVar3) + -0x359d3e2a + uVar12 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 ^ uVar2 ^ uVar5) + -0x359d3e2a + uVar13 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar4 ^ uVar2) + -0x359d3e2a + uVar14 + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 ^ uVar1 ^ uVar4) + -0x359d3e2a + uVar15 + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar8 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
    uVar4 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 ^ uVar3 ^ uVar1) + -0x359d3e2a + uVar8 + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar9 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
    uVar1 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar2 ^ uVar5 ^ uVar3) + -0x359d3e2a + uVar9 + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar10 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
    uVar3 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar4 ^ uVar2 ^ uVar5) + -0x359d3e2a + uVar10 + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar5 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar4 ^ uVar2) + -0x359d3e2a +
            ((uVar8 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar8 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f) +
            uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar2 = (uVar5 * 0x20 | uVar5 >> 0x1b) + (uVar3 ^ uVar1 ^ uVar4) + -0x359d3e2a +
            ((uVar9 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar9 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f) +
            uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    ctx->hash[0] = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar5 ^ uVar3 ^ uVar1) + -0x359d3e2a +
                   ((uVar10 ^ uVar13 ^ uVar7 ^ uVar21) << 1 |
                   (uVar10 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f) + uVar4 + ctx->hash[0];
    ctx->hash[1] = uVar2 + ctx->hash[1];
    ctx->hash[2] = (uVar5 * 0x40000000 | uVar5 >> 2) + ctx->hash[2];
    ctx->hash[3] = uVar3 + ctx->hash[3];
    ctx->hash[4] = uVar1 + ctx->hash[4];
  }
  return;
}

Assistant:

static void
pp_crypto_hash_sha1_process (PHashSHA1		*ctx,
			     const puint32	data[16])
{
	puint32	W[16];
	puint32	A;
	puint32	B;
	puint32	C;
	puint32	D;
	puint32	E;

	if (P_UNLIKELY (ctx == NULL))
		return;

	memcpy (W, data, 64);

	A = ctx->hash[0];
	B = ctx->hash[1];
	C = ctx->hash[2];
	D = ctx->hash[3];
	E = ctx->hash[4];

	P_SHA1_ROUND_0 (A, B, C, D, E, W[0])
	P_SHA1_ROUND_0 (E, A, B, C, D, W[1])
	P_SHA1_ROUND_0 (D, E, A, B, C, W[2])
	P_SHA1_ROUND_0 (C, D, E, A, B, W[3])
	P_SHA1_ROUND_0 (B, C, D, E, A, W[4])
	P_SHA1_ROUND_0 (A, B, C, D, E, W[5])
	P_SHA1_ROUND_0 (E, A, B, C, D, W[6])
	P_SHA1_ROUND_0 (D, E, A, B, C, W[7])
	P_SHA1_ROUND_0 (C, D, E, A, B, W[8])
	P_SHA1_ROUND_0 (B, C, D, E, A, W[9])
	P_SHA1_ROUND_0 (A, B, C, D, E, W[10])
	P_SHA1_ROUND_0 (E, A, B, C, D, W[11])
	P_SHA1_ROUND_0 (D, E, A, B, C, W[12])
	P_SHA1_ROUND_0 (C, D, E, A, B, W[13])
	P_SHA1_ROUND_0 (B, C, D, E, A, W[14])
	P_SHA1_ROUND_0 (A, B, C, D, E, W[15])
	P_SHA1_ROUND_0 (E, A, B, C, D, P_SHA1_W (W, 16))
	P_SHA1_ROUND_0 (D, E, A, B, C, P_SHA1_W (W, 17))
	P_SHA1_ROUND_0 (C, D, E, A, B, P_SHA1_W (W, 18))
	P_SHA1_ROUND_0 (B, C, D, E, A, P_SHA1_W (W, 19))

	P_SHA1_ROUND_1 (A, B, C, D, E, P_SHA1_W (W, 20))
	P_SHA1_ROUND_1 (E, A, B, C, D, P_SHA1_W (W, 21))
	P_SHA1_ROUND_1 (D, E, A, B, C, P_SHA1_W (W, 22))
	P_SHA1_ROUND_1 (C, D, E, A, B, P_SHA1_W (W, 23))
	P_SHA1_ROUND_1 (B, C, D, E, A, P_SHA1_W (W, 24))
	P_SHA1_ROUND_1 (A, B, C, D, E, P_SHA1_W (W, 25))
	P_SHA1_ROUND_1 (E, A, B, C, D, P_SHA1_W (W, 26))
	P_SHA1_ROUND_1 (D, E, A, B, C, P_SHA1_W (W, 27))
	P_SHA1_ROUND_1 (C, D, E, A, B, P_SHA1_W (W, 28))
	P_SHA1_ROUND_1 (B, C, D, E, A, P_SHA1_W (W, 29))
	P_SHA1_ROUND_1 (A, B, C, D, E, P_SHA1_W (W, 30))
	P_SHA1_ROUND_1 (E, A, B, C, D, P_SHA1_W (W, 31))
	P_SHA1_ROUND_1 (D, E, A, B, C, P_SHA1_W (W, 32))
	P_SHA1_ROUND_1 (C, D, E, A, B, P_SHA1_W (W, 33))
	P_SHA1_ROUND_1 (B, C, D, E, A, P_SHA1_W (W, 34))
	P_SHA1_ROUND_1 (A, B, C, D, E, P_SHA1_W (W, 35))
	P_SHA1_ROUND_1 (E, A, B, C, D, P_SHA1_W (W, 36))
	P_SHA1_ROUND_1 (D, E, A, B, C, P_SHA1_W (W, 37))
	P_SHA1_ROUND_1 (C, D, E, A, B, P_SHA1_W (W, 38))
	P_SHA1_ROUND_1 (B, C, D, E, A, P_SHA1_W (W, 39))

	P_SHA1_ROUND_2 (A, B, C, D, E, P_SHA1_W (W, 40))
	P_SHA1_ROUND_2 (E, A, B, C, D, P_SHA1_W (W, 41))
	P_SHA1_ROUND_2 (D, E, A, B, C, P_SHA1_W (W, 42))
	P_SHA1_ROUND_2 (C, D, E, A, B, P_SHA1_W (W, 43))
	P_SHA1_ROUND_2 (B, C, D, E, A, P_SHA1_W (W, 44))
	P_SHA1_ROUND_2 (A, B, C, D, E, P_SHA1_W (W, 45))
	P_SHA1_ROUND_2 (E, A, B, C, D, P_SHA1_W (W, 46))
	P_SHA1_ROUND_2 (D, E, A, B, C, P_SHA1_W (W, 47))
	P_SHA1_ROUND_2 (C, D, E, A, B, P_SHA1_W (W, 48))
	P_SHA1_ROUND_2 (B, C, D, E, A, P_SHA1_W (W, 49))
	P_SHA1_ROUND_2 (A, B, C, D, E, P_SHA1_W (W, 50))
	P_SHA1_ROUND_2 (E, A, B, C, D, P_SHA1_W (W, 51))
	P_SHA1_ROUND_2 (D, E, A, B, C, P_SHA1_W (W, 52))
	P_SHA1_ROUND_2 (C, D, E, A, B, P_SHA1_W (W, 53))
	P_SHA1_ROUND_2 (B, C, D, E, A, P_SHA1_W (W, 54))
	P_SHA1_ROUND_2 (A, B, C, D, E, P_SHA1_W (W, 55))
	P_SHA1_ROUND_2 (E, A, B, C, D, P_SHA1_W (W, 56))
	P_SHA1_ROUND_2 (D, E, A, B, C, P_SHA1_W (W, 57))
	P_SHA1_ROUND_2 (C, D, E, A, B, P_SHA1_W (W, 58))
	P_SHA1_ROUND_2 (B, C, D, E, A, P_SHA1_W (W, 59))

	P_SHA1_ROUND_3 (A, B, C, D, E, P_SHA1_W (W, 60))
	P_SHA1_ROUND_3 (E, A, B, C, D, P_SHA1_W (W, 61))
	P_SHA1_ROUND_3 (D, E, A, B, C, P_SHA1_W (W, 62))
	P_SHA1_ROUND_3 (C, D, E, A, B, P_SHA1_W (W, 63))
	P_SHA1_ROUND_3 (B, C, D, E, A, P_SHA1_W (W, 64))
	P_SHA1_ROUND_3 (A, B, C, D, E, P_SHA1_W (W, 65))
	P_SHA1_ROUND_3 (E, A, B, C, D, P_SHA1_W (W, 66))
	P_SHA1_ROUND_3 (D, E, A, B, C, P_SHA1_W (W, 67))
	P_SHA1_ROUND_3 (C, D, E, A, B, P_SHA1_W (W, 68))
	P_SHA1_ROUND_3 (B, C, D, E, A, P_SHA1_W (W, 69))
	P_SHA1_ROUND_3 (A, B, C, D, E, P_SHA1_W (W, 70))
	P_SHA1_ROUND_3 (E, A, B, C, D, P_SHA1_W (W, 71))
	P_SHA1_ROUND_3 (D, E, A, B, C, P_SHA1_W (W, 72))
	P_SHA1_ROUND_3 (C, D, E, A, B, P_SHA1_W (W, 73))
	P_SHA1_ROUND_3 (B, C, D, E, A, P_SHA1_W (W, 74))
	P_SHA1_ROUND_3 (A, B, C, D, E, P_SHA1_W (W, 75))
	P_SHA1_ROUND_3 (E, A, B, C, D, P_SHA1_W (W, 76))
	P_SHA1_ROUND_3 (D, E, A, B, C, P_SHA1_W (W, 77))
	P_SHA1_ROUND_3 (C, D, E, A, B, P_SHA1_W (W, 78))
	P_SHA1_ROUND_3 (B, C, D, E, A, P_SHA1_W (W, 79))

	ctx->hash[0] += A;
	ctx->hash[1] += B;
	ctx->hash[2] += C;
	ctx->hash[3] += D;
	ctx->hash[4] += E;
}